

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles3::Functional::eval_refract_vec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_20;
  undefined8 uStack_18;
  
  auVar1 = *(undefined1 (*) [16])c->in[0].m_data;
  auVar2 = auVar1._4_12_;
  local_38.m_data[3] = auVar1._0_4_;
  local_38.m_data[0] = (float)auVar2._0_4_;
  local_38.m_data[1] = (float)auVar2._4_4_;
  local_38.m_data[2] = (float)auVar2._8_4_;
  local_48.m_data[3] = c->in[1].m_data[0];
  local_48.m_data[2] = c->in[1].m_data[1];
  local_48.m_data[1] = c->in[1].m_data[2];
  local_48.m_data[0] = c->in[1].m_data[3];
  tcu::refract<float,4>((tcu *)&local_20,&local_38,&local_48,c->in[2].m_data[1]);
  *(undefined8 *)(c->color).m_data = local_20;
  *(undefined8 *)((c->color).m_data + 2) = uStack_18;
  return;
}

Assistant:

void eval_refract_vec4	(ShaderEvalContext& c) { c.color		= refract(c.in[0].swizzle(1, 2, 3, 0), c.in[1].swizzle(3, 2, 1, 0), c.in[2].y()); }